

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O0

void __thiscall re2c::If::If(If *this,type_t t,Span *sp,uint32_t nsp,State *next)

{
  Binary *this_00;
  Linear *this_01;
  State *next_local;
  uint32_t nsp_local;
  Span *sp_local;
  type_t t_local;
  If *this_local;
  
  this->type = t;
  (this->info).binary = (Binary *)0x0;
  if (this->type == BINARY) {
    this_00 = (Binary *)operator_new(0x18);
    Binary::Binary(this_00,sp,nsp,next);
    (this->info).binary = this_00;
  }
  else if (this->type == LINEAR) {
    this_01 = (Linear *)operator_new(0x18);
    Linear::Linear(this_01,sp,nsp,next);
    (this->info).linear = this_01;
  }
  return;
}

Assistant:

If::If (type_t t, const Span * sp, uint32_t nsp, const State * next)
	: type (t)
	, info ()
{
	switch (type)
	{
		case BINARY:
			info.binary = new Binary (sp, nsp, next);
			break;
		case LINEAR:
			info.linear = new Linear (sp, nsp, next);
			break;
	}
}